

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucln_in.cpp
# Opt level: O3

UBool i18n_cleanup(void)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(code **)((long)gCleanupFunctions + lVar1) != (code *)0x0) {
      (**(code **)((long)gCleanupFunctions + lVar1))();
      *(undefined8 *)((long)gCleanupFunctions + lVar1) = 0;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x110);
  return '\x01';
}

Assistant:

static UBool U_CALLCONV i18n_cleanup(void)
{
    int32_t libType = UCLN_I18N_START;
    (void)copyright;   /* Suppress unused variable warning with clang. */

    while (++libType<UCLN_I18N_COUNT) {
        if (gCleanupFunctions[libType])
        {
            gCleanupFunctions[libType]();
            gCleanupFunctions[libType] = NULL;
        }
    }
#if !UCLN_NO_AUTO_CLEANUP && (defined(UCLN_AUTO_ATEXIT) || defined(UCLN_AUTO_LOCAL))
    ucln_unRegisterAutomaticCleanup();
#endif
    return TRUE;
}